

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

Loop * __thiscall
spvtools::opt::LoopDescriptor::AddLoopNest
          (LoopDescriptor *this,
          unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *new_loop)

{
  bool bVar1;
  BasicBlockListTy *this_00;
  reference pvVar2;
  PostOrderTreeDFIterator<spvtools::opt::Loop> *in_RCX;
  pair<unsigned_int,_spvtools::opt::Loop_*> pVar3;
  Loop *local_280;
  pair<unsigned_int,_spvtools::opt::Loop_*> local_278;
  value_type_conflict local_264;
  _Node_iterator_base<unsigned_int,_false> _Stack_260;
  uint32_t bb_id;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlockListTy *__range3;
  Loop *local_240;
  Loop *current_loop;
  PostOrderTreeDFIterator<spvtools::opt::Loop> __end2;
  PostOrderTreeDFIterator<spvtools::opt::Loop> __begin2;
  PostOrderTreeDFIterator<spvtools::opt::Loop> local_130;
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>_> local_d8;
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>_> *local_28;
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>_> *__range2;
  Loop *loop;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *new_loop_local;
  LoopDescriptor *this_local;
  
  loop = (Loop *)new_loop;
  new_loop_local =
       (unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *)this;
  __range2 = (IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>_> *)
             std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
             release(new_loop);
  bVar1 = Loop::HasParent((Loop *)__range2);
  if (!bVar1) {
    std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
              (&(this->placeholder_top_loop_).nested_loops_,(value_type *)&__range2);
  }
  PostOrderTreeDFIterator<spvtools::opt::Loop>::begin(&local_130,(NodePtr)__range2);
  PostOrderTreeDFIterator<spvtools::opt::Loop>::end
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),(NodePtr)0x0);
  make_range<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>>
            (&local_d8,(opt *)&local_130,
             (PostOrderTreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),in_RCX);
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator(&local_130);
  local_28 = &local_d8;
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>_>::begin
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),local_28);
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>_>::end
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)&current_loop,local_28);
  while( true ) {
    bVar1 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator!=
                      ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                       ((long)&__end2.parent_iterators_.c.
                               super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                       (PostOrderTreeDFIterator<spvtools::opt::Loop> *)&current_loop);
    if (!bVar1) break;
    __range3 = (BasicBlockListTy *)
               PostOrderTreeDFIterator<spvtools::opt::Loop>::operator*
                         ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                          ((long)&__end2.parent_iterators_.c.
                                  super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    local_240 = (Loop *)__range3;
    std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
              (&this->loops_,(value_type *)&__range3);
    this_00 = Loop::GetBlocks(local_240);
    __end3 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::begin(this_00);
    _Stack_260._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end(this_00);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end3.super__Node_iterator_base<unsigned_int,_false>,
                         &stack0xfffffffffffffda0);
      if (!bVar1) break;
      pvVar2 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end3);
      local_264 = *pvVar2;
      local_280 = local_240;
      pVar3 = std::make_pair<unsigned_int&,spvtools::opt::Loop*>(&local_264,&local_280);
      local_278.second = pVar3.second;
      local_278.first = pVar3.first;
      std::
      unordered_map<unsigned_int,spvtools::opt::Loop*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>>
      ::insert<std::pair<unsigned_int,spvtools::opt::Loop*>>
                ((unordered_map<unsigned_int,spvtools::opt::Loop*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>>
                  *)&this->basic_block_to_loop_,&local_278);
      std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end3);
    }
    PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__end2.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  }
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)&current_loop);
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>_>::~IteratorRange
            (&local_d8);
  return (Loop *)__range2;
}

Assistant:

Loop* LoopDescriptor::AddLoopNest(std::unique_ptr<Loop> new_loop) {
  Loop* loop = new_loop.release();
  if (!loop->HasParent()) placeholder_top_loop_.nested_loops_.push_back(loop);
  // Iterate from inner to outer most loop, adding basic block to loop mapping
  // as we go.
  for (Loop& current_loop :
       make_range(iterator::begin(loop), iterator::end(nullptr))) {
    loops_.push_back(&current_loop);
    for (uint32_t bb_id : current_loop.GetBlocks())
      basic_block_to_loop_.insert(std::make_pair(bb_id, &current_loop));
  }

  return loop;
}